

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEndedEarly(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  *in_RSI;
  value_type *in_RDI;
  vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *unaff_retaddr;
  
  bVar1 = clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::empty
                    (unaff_retaddr);
  if (bVar1) {
    ppIVar2 = clara::std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(in_RSI);
    (*(*ppIVar2)->_vptr_ITracker[9])();
  }
  else {
    ppIVar2 = clara::std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(in_RSI);
    (*(*ppIVar2)->_vptr_ITracker[8])();
  }
  clara::std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::pop_back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              *)0x12a20d);
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void RunContext::sectionEndedEarly(SectionEndInfo const & endInfo) {
        if (m_unfinishedSections.empty())
            m_activeSections.back()->fail();
        else
            m_activeSections.back()->close();
        m_activeSections.pop_back();

        m_unfinishedSections.push_back(endInfo);
    }